

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O0

void __thiscall pstore::transaction_base::transaction_base(transaction_base *this,database *db)

{
  bool bVar1;
  address aVar2;
  uint64_t uVar3;
  database *db_local;
  transaction_base *this_local;
  
  this->_vptr_transaction_base = (_func_int **)&PTR__transaction_base_003d8188;
  this->db_ = db;
  this->size_ = 0;
  this->dbsize_ = 0;
  aVar2 = address::null();
  (this->first_).a_ = aVar2.a_;
  bVar1 = database::is_writable(db);
  if (!bVar1) {
    raise<pstore::error_code>(transaction_on_read_only_database);
  }
  database::sync(this->db_);
  uVar3 = database::size(db);
  this->dbsize_ = uVar3;
  return;
}

Assistant:

transaction_base::transaction_base (database & db)
            : db_{db} {
        if (!db.is_writable ()) {
            raise (error_code::transaction_on_read_only_database);
        }

        // First thing that creating a transaction does is update the view
        // to that of the head revision.
        db_.sync ();
        dbsize_ = db.size ();
    }